

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void last_valueStepFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  long *plVar1;
  sqlite3_value *psVar2;
  LastValueCtx *p;
  sqlite3_value **apArg_local;
  int nArg_local;
  sqlite3_context *pCtx_local;
  
  plVar1 = (long *)sqlite3_aggregate_context(pCtx,0x10);
  if (plVar1 != (long *)0x0) {
    sqlite3_value_free((sqlite3_value *)*plVar1);
    psVar2 = sqlite3_value_dup(*apArg);
    *plVar1 = (long)psVar2;
    if (*plVar1 == 0) {
      sqlite3_result_error_nomem(pCtx);
    }
    else {
      *(int *)(plVar1 + 1) = (int)plVar1[1] + 1;
    }
  }
  return;
}

Assistant:

static void last_valueStepFunc(
  sqlite3_context *pCtx,
  int nArg,
  sqlite3_value **apArg
){
  struct LastValueCtx *p;
  UNUSED_PARAMETER(nArg);
  p = (struct LastValueCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    sqlite3_value_free(p->pVal);
    p->pVal = sqlite3_value_dup(apArg[0]);
    if( p->pVal==0 ){
      sqlite3_result_error_nomem(pCtx);
    }else{
      p->nVal++;
    }
  }
}